

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O3

StringTree * __thiscall
kj::StringTree::
concat<kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::StringTree,kj::FixedArray<char,1ul>>
          (StringTree *__return_storage_ptr__,StringTree *this,ArrayPtr<const_char> *params,
          FixedArray<char,_1UL> *params_1,StringTree *params_2,FixedArray<char,_1UL> *params_3)

{
  Branch *pBVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  char *__n;
  Branch *pBVar4;
  char *pcVar5;
  String local_50;
  ArrayPtr<const_char> *local_38;
  
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->text).content.size_ = 0;
  pcVar5 = (this->text).content.ptr;
  __return_storage_ptr__->size_ = (size_t)(pcVar5 + *(long *)params_1 + 2);
  heapString(&local_50,(size_t)(pcVar5 + 2));
  (__return_storage_ptr__->text).content.ptr = local_50.content.ptr;
  (__return_storage_ptr__->text).content.size_ = local_50.content.size_;
  (__return_storage_ptr__->text).content.disposer = local_50.content.disposer;
  local_38 = params;
  pBVar4 = (Branch *)
           kj::_::HeapArrayDisposer::allocateImpl
                     (0x40,1,1,kj::_::HeapArrayDisposer::Allocate_<kj::StringTree::Branch>::
                               construct,ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  local_50.content.size_ = 1;
  local_50.content.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  pBVar1 = (__return_storage_ptr__->branches).ptr;
  local_50.content.ptr = (char *)pBVar4;
  if (pBVar1 != (Branch *)0x0) {
    sVar2 = (__return_storage_ptr__->branches).size_;
    (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
    (__return_storage_ptr__->branches).size_ = 0;
    pAVar3 = (__return_storage_ptr__->branches).disposer;
    (**pAVar3->_vptr_ArrayDisposer)
              (pAVar3,pBVar1,0x40,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  }
  (__return_storage_ptr__->branches).ptr = pBVar4;
  (__return_storage_ptr__->branches).size_ = 1;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance
  ;
  pcVar5 = (char *)(__return_storage_ptr__->text).content.size_;
  if (pcVar5 != (char *)0x0) {
    pcVar5 = (__return_storage_ptr__->text).content.ptr;
  }
  __n = (this->text).content.ptr;
  if (__n != (char *)0x0) {
    memcpy(pcVar5,(void *)this->size_,(size_t)__n);
    pcVar5 = pcVar5 + (long)__n;
  }
  *pcVar5 = *(char *)&local_38->ptr;
  fill<kj::FixedArray<char,1ul>>
            (__return_storage_ptr__,pcVar5 + 1,0,(StringTree *)params_1,
             (FixedArray<char,_1UL> *)params_2);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}